

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GroupTableAlloc(TA_StringTable **table)

{
  TA_StringTable *__s;
  TA_StringTablePriv *stringTablePriv;
  TA_StringTable *stringTable;
  TA_StringTable **table_local;
  
  if (table == (TA_StringTable **)0x0) {
    table_local._4_4_ = TA_BAD_PARAM;
  }
  else {
    __s = (TA_StringTable *)malloc(0x1c);
    if (__s == (TA_StringTable *)0x0) {
      *table = (TA_StringTable *)0x0;
      table_local._4_4_ = TA_ALLOC_ERR;
    }
    else {
      memset(__s,0,0x1c);
      __s[1].size = 0xa20bb20b;
      __s->size = 10;
      __s->string = TA_GroupString;
      __s->hiddenData = __s + 1;
      *table = __s;
      table_local._4_4_ = TA_SUCCESS;
    }
  }
  return table_local._4_4_;
}

Assistant:

TA_RetCode TA_GroupTableAlloc( TA_StringTable **table )
{
   TA_StringTable *stringTable;
   TA_StringTablePriv *stringTablePriv;

   if( table == NULL )
   {
      return TA_BAD_PARAM;
   }

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_GROUP_MAGIC_NB;

   stringTable->size = TA_NB_GROUP_ID;
   stringTable->string = &TA_GroupString[0];
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */

   /* Success. Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}